

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandExpand(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t FileType;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk_01;
  Gia_Man_t *pGia;
  uint fVerbose;
  char *pcVar2;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar2 = "Empty network.\n";
    }
    else if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
      iVar1 = Abc_NtkLevel(pNtk);
      if (iVar1 < 2) {
        if (globalUtilOptind + 1 == argc) {
          pcVar2 = argv[globalUtilOptind];
          FileType = Io_ReadFileType(pcVar2);
          pNtk_00 = Io_Read(pcVar2,FileType,1,0);
          if (pNtk_00 == (Abc_Ntk_t *)0x0) {
            Abc_Print(-1,"Failed to read the current network from file \"%s\".\n",pcVar2);
            return 1;
          }
        }
        else {
          Abc_Print(0,"Using the complement of the current network as its offset.\n");
          pNtk_00 = Abc_NtkDup(pNtk);
        }
        pNtk_01 = Abc_NtkStrash(pNtk_00,0,1,0);
        Abc_NtkDelete(pNtk_00);
        pGia = Abc_NtkClpGia(pNtk_01);
        Abc_NtkDelete(pNtk_01);
        Abc_NtkExpandCubes(pNtk,pGia,fVerbose);
        Gia_ManStop(pGia);
        return 0;
      }
      pcVar2 = "The number of logic levels is more than 1 (collapse the network and try again).\n";
    }
    else {
      pcVar2 = "Only a SOP logic network can be transformed into cubes.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: expand [-vh] <file>\n");
    Abc_Print(-2,"\t        expands cubes against the offset\n");
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v    : toggle verbose output [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    pcVar2 = "\tfile  : (optional) representation of on-set plus dc-set\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandExpand( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Abc_NtkClpGia( Abc_Ntk_t * pNtk );
    extern void Abc_NtkExpandCubes( Abc_Ntk_t * pNtk, Gia_Man_t * pGia, int fVerbose );
    Abc_Ntk_t * pStrash, * pNtk2, * pNtk = Abc_FrameReadNtk(pAbc);
    Gia_Man_t * pGia; int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Only a SOP logic network can be transformed into cubes.\n" );
        return 1;
    }
    if ( Abc_NtkLevel(pNtk) > 1 )
    {
        Abc_Print( -1, "The number of logic levels is more than 1 (collapse the network and try again).\n" );
        return 1;
    }
    // read the offset representation
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( 0, "Using the complement of the current network as its offset.\n" );
        pNtk2 = Abc_NtkDup( pNtk );
    }
    else
    {
        char * FileName = argv[globalUtilOptind];
        pNtk2 = Io_Read( FileName, Io_ReadFileType(FileName), 1, 0 );
        if ( pNtk2 == NULL )
        {
            Abc_Print( -1, "Failed to read the current network from file \"%s\".\n", FileName );
            return 1;
        }
    }
    // strash the network
    pStrash = Abc_NtkStrash( pNtk2, 0, 1, 0 );
    Abc_NtkDelete( pNtk2 );
    // convert it into an AIG
    pGia = Abc_NtkClpGia( pStrash );
    //Gia_AigerWrite( pGia, "aig_dump.aig", 0, 0 );
    Abc_NtkDelete( pStrash );
    // get the new network
    Abc_NtkExpandCubes( pNtk, pGia, fVerbose );
    Gia_ManStop( pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: expand [-vh] <file>\n" );
    Abc_Print( -2, "\t        expands cubes against the offset\n" );
    Abc_Print( -2, "\t-v    : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\tfile  : (optional) representation of on-set plus dc-set\n");

    return 1;
}